

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O3

char * flatcc_json_parser_finalize_unions
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t handle)

{
  void *pvVar1;
  char *pcVar2;
  
  pvVar1 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  pcVar2 = buf;
  if ((*(long *)((long)pvVar1 + 8) != 0) && (pcVar2 = end, ctx->error == 0)) {
    ctx->error = 0x1b;
    ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
    ctx->error_loc = buf;
  }
  flatcc_builder_exit_user_frame_at(ctx->ctx,handle);
  return pcVar2;
}

Assistant:

const char *flatcc_json_parser_finalize_unions(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t handle)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);

    if (f->union_count) {
        buf = flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_union_incomplete);
    }
    flatcc_builder_exit_user_frame_at(ctx->ctx, handle);
    return buf;
}